

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_189743::CBSTest_ASN1Int64_Test::TestBody(CBSTest_ASN1Int64_Test *this)

{
  CBS_ASN1_TAG tag;
  anon_union_32_2_4f6aaa2e_for_u *paVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  size_type *lhs;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  ScopedTrace *this_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  char *pcVar9;
  char *in_R9;
  ScopedTrace gtest_trace_1091;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  ScopedTrace gtest_trace_1092;
  ScopedCBB cbb;
  UniquePtr<uint8_t> scoper;
  int is_negative;
  CBS cbs;
  size_t len;
  CBS child;
  uint8_t *out;
  UniquePtr<uint8_t> scoper_1;
  int64_t value;
  ScopedTrace local_121;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  undefined1 local_100 [24];
  Bytes local_e8;
  undefined1 local_d8 [16];
  anon_union_32_2_4f6aaa2e_for_u local_c8;
  Bytes local_a8;
  int local_94;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  CBS local_70;
  anon_union_32_2_4f6aaa2e_for_u *local_60;
  _Head_base<0UL,_unsigned_char_*,_false> local_58;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_50;
  size_type *local_48;
  _Head_base<0UL,_unsigned_char_*,_false> local_40;
  long local_38;
  
  lVar7 = 0;
  do {
    local_48 = (size_type *)((long)&(anonymous_namespace)::kASN1Int64Tests + lVar7);
    paVar1 = *(anon_union_32_2_4f6aaa2e_for_u **)((long)&PTR_anon_var_dwarf_1aa6cf_006ccbd8 + lVar7)
    ;
    pbVar6 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (&DAT_006ccbe0 + lVar7);
    local_d8._0_8_ = paVar1;
    local_d8._8_8_ = pbVar6;
    local_38 = lVar7;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_121,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x443,(Bytes *)local_d8);
    lhs = local_48;
    testing::ScopedTrace::ScopedTrace<long>
              ((ScopedTrace *)(local_100 + 0x17),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x444,(long *)local_48);
    local_90 = (undefined1  [8])paVar1;
    local_88 = pbVar6;
    local_78 = pbVar6;
    iVar5 = CBS_get_asn1_int64((CBS *)local_90,(int64_t *)&local_40);
    local_110[0] = (internal)(iVar5 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1_int64(&cbs, &value)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,1099,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      _Var8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(local_70.data._4_4_,local_70.data._0_4_);
LAB_0021b459:
      if ((anon_union_32_2_4f6aaa2e_for_u *)_Var8._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (*(code *)((cbb_child_st *)_Var8._M_head_impl)->base->len)();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
LAB_0021b608:
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(local_100 + 0x17));
      this_00 = &local_121;
      goto LAB_0021b617;
    }
    local_70.data._0_4_ = 0;
    local_110 = (undefined1  [8])local_88;
    local_60 = paVar1;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d8,"0u","CBS_len(&cbs)",(uint *)&local_70,
               (unsigned_long *)local_110);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x44c,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_d8,"test.value","value",(long *)lhs,(long *)&local_40);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x44d,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_90 = (undefined1  [8])local_60;
    local_88 = local_78;
    iVar5 = CBS_get_asn1((CBS *)local_90,&local_70,2);
    local_110[0] = (internal)(iVar5 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1(&cbs, &child, 0x2u)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x452,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      _Var8._M_head_impl = local_120._M_head_impl;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
        _Var8._M_head_impl = local_120._M_head_impl;
      }
      goto LAB_0021b459;
    }
    iVar5 = CBS_is_valid_asn1_integer(&local_70,&local_94);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      local_110[0] = (internal)(iVar5 != 0);
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x453,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_120._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_120._M_head_impl + 8))();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
    }
    sVar2 = *lhs;
    local_110[0] = (internal)(byte)(sVar2 >> 0x3f);
    local_120._M_head_impl._0_1_ = (internal)(local_94 != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_d8,"test.value < 0","!!is_negative",(bool *)local_110,
               (bool *)&local_120);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x454,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_110[0] = (internal)(-1 < (long)sVar2);
    iVar5 = CBS_is_unsigned_asn1_integer(&local_70);
    local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_d8,"test.value >= 0","!!CBS_is_unsigned_asn1_integer(&child)",
               (bool *)local_110,(bool *)&local_120);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x455,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    CBB_zero((CBB *)local_d8);
    iVar5 = CBB_init((CBB *)local_d8,0);
    local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x459,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
LAB_0021b5b1:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e8.span_.data_ + 8))();
      }
      if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,local_118);
      }
      CBB_cleanup((CBB *)local_d8);
      goto LAB_0021b608;
    }
    iVar5 = CBB_add_asn1_int64((CBB *)local_d8,sVar2);
    local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_add_asn1_int64(cbb.get(), test.value)","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x45a,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
      goto LAB_0021b5b1;
    }
    iVar5 = CBB_finish((CBB *)local_d8,&local_58._M_head_impl,(size_t *)&local_80);
    local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x45b,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
      goto LAB_0021b5b1;
    }
    local_a8.span_.data_ = local_58._M_head_impl;
    local_120._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
    local_118 = local_78;
    local_e8.span_.data_ = local_58._M_head_impl;
    local_e8.span_.size_ =
         (size_t)local_80._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(test.encoding, test.encoding_len)","Bytes(out, len)",
               (Bytes *)&local_120,&local_e8);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_120);
      pcVar9 = "";
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = (local_108->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x45d,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_120._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_120._M_head_impl + 8))();
      }
    }
    if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,local_108);
    }
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_a8);
    CBB_cleanup((CBB *)local_d8);
    CBB_zero((CBB *)local_d8);
    iVar5 = CBB_init((CBB *)local_d8,0);
    local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x463,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
LAB_0021a8a3:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e8.span_.data_ + 8))();
      }
      if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,local_118);
      }
      bVar4 = false;
    }
    else {
      iVar5 = CBB_add_asn1_int64_with_tag((CBB *)local_d8,sVar2,0x80000001);
      local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)&local_120,
                   (AssertionResult *)
                   "CBB_add_asn1_int64_with_tag(cbb.get(), test.value, (0x80u << 24) | 1)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x465,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
        goto LAB_0021a8a3;
      }
      iVar5 = CBB_finish((CBB *)local_d8,&local_58._M_head_impl,(size_t *)&local_80);
      local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)&local_120,
                   (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x466,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
        goto LAB_0021a8a3;
      }
      local_50._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_58._M_head_impl;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_110,(char *)local_60,
                 (char *)((long)&(local_60->base).buf + (long)&local_78->_M_dataplus),
                 (allocator_type *)&local_120);
      *(char *)local_110 = -0x7f;
      local_e8.span_.size_ = (long)local_108 - (long)local_110;
      local_e8.span_.data_ = (uchar *)local_110;
      local_a8.span_.data_ = local_58._M_head_impl;
      local_a8.span_.size_ =
           (size_t)local_80._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&local_120,"Bytes(expected)","Bytes(out, len)",&local_e8,&local_a8);
      if (local_120._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_e8);
        pcVar9 = "";
        if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_118->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x46b,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8.span_.data_ !=
            (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          (**(code **)(*(long *)local_e8.span_.data_ + 8))();
        }
      }
      if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,local_118);
      }
      if (local_110 != (undefined1  [8])0x0) {
        operator_delete((void *)local_110,local_100._0_8_ - (long)local_110);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_50);
      bVar4 = true;
    }
    CBB_cleanup((CBB *)local_d8);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(local_100 + 0x17));
    testing::ScopedTrace::~ScopedTrace(&local_121);
    if (!bVar4) {
      return;
    }
    lVar7 = local_38 + 0x18;
  } while (lVar7 != 0x138);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_006ccd20;
  lVar7 = 0x90;
  do {
    paVar1 = (anon_union_32_2_4f6aaa2e_for_u *)pbVar6[-1].field_2._M_allocated_capacity;
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((long)&pbVar6[-1].field_2 + 8);
    local_d8._0_8_ = paVar1;
    local_d8._8_8_ = pbVar3;
    local_78 = pbVar6;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x470,(Bytes *)local_d8);
    local_110 = (undefined1  [8])paVar1;
    local_108 = pbVar3;
    iVar5 = CBS_get_asn1_int64((CBS *)local_110,(int64_t *)&local_70);
    local_90[0] = (internal)(iVar5 == 0);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 != 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_90,
                 (AssertionResult *)"CBS_get_asn1_int64(&cbs, &value)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x475,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_120._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_120._M_head_impl + 8))();
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
    }
    local_110 = (undefined1  [8])paVar1;
    local_108 = pbVar3;
    iVar5 = CBS_get_asn1((CBS *)local_110,(CBS *)local_d8,2);
    if (iVar5 != 0) {
      iVar5 = CBS_is_valid_asn1_integer((CBS *)local_d8,(int *)0x0);
      local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)local_90,"test.overflow","!!CBS_is_valid_asn1_integer(&child, __null)",
                 (bool *)local_78,(bool *)&local_120);
      if (local_90[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_120);
        pcVar9 = "";
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_88->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x47a,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_120._M_head_impl !=
            (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          (**(code **)(*(long *)local_120._M_head_impl + 8))();
        }
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_a8);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_78->field_2 + 8);
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != 0);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    paVar1 = (anon_union_32_2_4f6aaa2e_for_u *)pbVar6[0x3666d].field_2._M_allocated_capacity;
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((long)&pbVar6[0x3666d].field_2 + 8);
    local_d8._0_8_ = paVar1;
    local_d8._8_8_ = pbVar3;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_94,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x47f,(Bytes *)local_d8);
    local_48 = &pbVar6[0x3666d]._M_string_length;
    testing::ScopedTrace::ScopedTrace<long>
              (&local_121,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x480,(long *)&pbVar6[0x3666d]._M_string_length);
    tag = *(CBS_ASN1_TAG *)&pbVar6[0x3666d]._M_dataplus._M_p;
    local_90 = (undefined1  [8])paVar1;
    local_88 = pbVar3;
    local_78 = pbVar6;
    local_60 = paVar1;
    iVar5 = CBS_get_asn1_int64_with_tag((CBS *)local_90,(int64_t *)&local_a8,tag);
    local_110[0] = (internal)(iVar5 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1_int64_with_tag(&cbs, &value, test.tag)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x487,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      _Var8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(local_70.data._4_4_,local_70.data._0_4_);
LAB_0021b74c:
      if ((anon_union_32_2_4f6aaa2e_for_u *)_Var8._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (*(code *)((cbb_child_st *)_Var8._M_head_impl)->base->len)();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
      testing::ScopedTrace::~ScopedTrace(&local_121);
      this_00 = (ScopedTrace *)&local_94;
LAB_0021b617:
      testing::ScopedTrace::~ScopedTrace(this_00);
      return;
    }
    local_70.data._0_4_ = 0;
    local_110 = (undefined1  [8])local_88;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d8,"0u","CBS_len(&cbs)",(uint *)&local_70,
               (unsigned_long *)local_110);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x488,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_d8,"test.value","value",(long *)local_48,(long *)&local_a8);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x489,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_90 = (undefined1  [8])local_60;
    local_88 = pbVar3;
    iVar5 = CBS_get_asn1((CBS *)local_90,&local_70,tag);
    local_110[0] = (internal)(iVar5 != 0);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_get_asn1(&cbs, &child, test.tag)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x48e,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      _Var8._M_head_impl = local_120._M_head_impl;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
        _Var8._M_head_impl = local_120._M_head_impl;
      }
      goto LAB_0021b74c;
    }
    iVar5 = CBS_is_valid_asn1_integer(&local_70,(int *)&local_50);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      local_110[0] = (internal)(iVar5 != 0);
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_110,
                 (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x48f,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8.base.buf + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_120._M_head_impl !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_120._M_head_impl + 8))();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
    }
    sVar2 = local_78[0x3666d]._M_string_length;
    local_110[0] = (internal)(byte)(sVar2 >> 0x3f);
    local_120._M_head_impl._0_1_ =
         (internal)
         ((int)local_50._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_d8,"test.value < 0","!!is_negative",(bool *)local_110,
               (bool *)&local_120);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x490,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    local_110[0] = (internal)(-1 < (long)sVar2);
    iVar5 = CBS_is_unsigned_asn1_integer(&local_70);
    local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_d8,"test.value >= 0","!!CBS_is_unsigned_asn1_integer(&child)",
               (bool *)local_110,(bool *)&local_120);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_110);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x491,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
      if (local_110 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_110 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d8._8_8_);
    }
    CBB_zero((CBB *)local_d8);
    iVar5 = CBB_init((CBB *)local_d8,0);
    local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)&local_120,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x495,(char *)local_110);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_e8);
LAB_0021b2a3:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,(ulong)(local_100._0_8_ + 1));
      }
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8.span_.data_ !=
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        (**(code **)(*(long *)local_e8.span_.data_ + 8))();
      }
      if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,local_118);
      }
      bVar4 = true;
    }
    else {
      iVar5 = CBB_add_asn1_int64_with_tag((CBB *)local_d8,sVar2,tag);
      local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)&local_120,
                   (AssertionResult *)"CBB_add_asn1_int64_with_tag(cbb.get(), test.value, test.tag)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x496,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_e8);
        goto LAB_0021b2a3;
      }
      iVar5 = CBB_finish((CBB *)local_d8,&local_40._M_head_impl,(size_t *)&local_58);
      local_120._M_head_impl._0_1_ = (internal)(iVar5 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_110,(internal *)&local_120,
                   (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x497,(char *)local_110);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_e8);
        goto LAB_0021b2a3;
      }
      local_80._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_40._M_head_impl;
      local_120._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
      local_e8.span_.data_ = local_40._M_head_impl;
      local_e8.span_.size_ = (size_t)local_58._M_head_impl;
      local_118 = pbVar3;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_110,"Bytes(test.encoding, test.encoding_len)","Bytes(out, len)",
                 (Bytes *)&local_120,&local_e8);
      if (local_110[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_120);
        pcVar9 = "";
        if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_108->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x499,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_120._M_head_impl !=
            (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
          (**(code **)(*(long *)local_120._M_head_impl + 8))();
        }
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_80);
      bVar4 = false;
    }
    CBB_cleanup((CBB *)local_d8);
    testing::ScopedTrace::~ScopedTrace(&local_121);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_94);
    pbVar6 = local_78 + 1;
    if (bVar4 || local_78 ==
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x80) {
      return;
    }
  } while( true );
}

Assistant:

TEST(CBSTest, ASN1Int64) {
  for (const ASN1Int64Test &test : kASN1Int64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    int64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_int64(&cbs, &value));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(test.value < 0, !!is_negative);
    EXPECT_EQ(test.value >= 0, !!CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64(cbb.get(), test.value));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }

    {
      // Overwrite the tag.
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64_with_tag(cbb.get(), test.value,
                                              CBS_ASN1_CONTEXT_SPECIFIC | 1));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      std::vector<uint8_t> expected(test.encoding,
                                    test.encoding + test.encoding_len);
      expected[0] = 0x81;
      EXPECT_EQ(Bytes(expected), Bytes(out, len));
    }
  }

  for (const ASN1InvalidInt64Test &test : kASN1InvalidInt64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    CBS cbs;
    int64_t value;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    EXPECT_FALSE(CBS_get_asn1_int64(&cbs, &value));

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    CBS child;
    if (CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER)) {
      EXPECT_EQ(test.overflow, !!CBS_is_valid_asn1_integer(&child, NULL));
    }
  }

  for (const ASN1Int64WithTagTest &test : kASN1Int64WithTagTests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    int64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_int64_with_tag(&cbs, &value, test.tag));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, test.tag));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(test.value < 0, !!is_negative);
    EXPECT_EQ(test.value >= 0, !!CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64_with_tag(cbb.get(), test.value, test.tag));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }
  }
}